

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covCore.c
# Opt level: O0

void Abc_NtkCovCovers_rec(Cov_Man_t *p,Abc_Obj_t *pObj,Vec_Ptr_t *vBoundary)

{
  int iVar1;
  Abc_Obj_t *pObj_00;
  Abc_Obj_t *pObj_01;
  Vec_Int_t *pVVar2;
  Abc_Obj_t *pObj1;
  Abc_Obj_t *pObj0;
  Vec_Ptr_t *vBoundary_local;
  Abc_Obj_t *pObj_local;
  Cov_Man_t *p_local;
  
  if (((*(uint *)&pObj->field_0x14 >> 5 & 1) == 0) && ((*(uint *)&pObj->field_0x14 >> 4 & 1) == 0))
  {
    *(uint *)&pObj->field_0x14 = *(uint *)&pObj->field_0x14 & 0xffffffdf | 0x20;
    pObj_00 = Abc_ObjFanin0(pObj);
    pObj_01 = Abc_ObjFanin1(pObj);
    Abc_NtkCovCovers_rec(p,pObj_00,vBoundary);
    Abc_NtkCovCovers_rec(p,pObj_01,vBoundary);
    if ((((*(uint *)&pObj_00->field_0x14 >> 4 & 1) == 0) &&
        (pVVar2 = Abc_ObjGetSupp(pObj_00), pVVar2 == (Vec_Int_t *)0x0)) ||
       ((((*(uint *)&pObj_01->field_0x14 >> 4 & 1) == 0 &&
         (pVVar2 = Abc_ObjGetSupp(pObj_01), pVVar2 == (Vec_Int_t *)0x0)) ||
        (iVar1 = Abc_NodeCovPropagate(p,pObj), iVar1 == 0)))) {
      if (((*(uint *)&pObj_00->field_0x14 >> 4 & 1) == 0) &&
         (pVVar2 = Abc_ObjGetSupp(pObj_00), pVVar2 != (Vec_Int_t *)0x0)) {
        Vec_PtrPush(vBoundary,pObj_00);
      }
      if (((*(uint *)&pObj_01->field_0x14 >> 4 & 1) == 0) &&
         (pVVar2 = Abc_ObjGetSupp(pObj_01), pVVar2 != (Vec_Int_t *)0x0)) {
        Vec_PtrPush(vBoundary,pObj_01);
      }
    }
  }
  return;
}

Assistant:

void Abc_NtkCovCovers_rec( Cov_Man_t * p, Abc_Obj_t * pObj, Vec_Ptr_t * vBoundary )
{
    Abc_Obj_t * pObj0, * pObj1;
    // return if the support is already computed
    if ( pObj->fMarkB || pObj->fMarkA )//|| Abc_ObjGetSupp(pObj) ) // why do we need Supp check here???
        return;
    // mark as visited
    pObj->fMarkB = 1;
    // get the fanins
    pObj0 = Abc_ObjFanin0(pObj);
    pObj1 = Abc_ObjFanin1(pObj);
    // solve for the fanins
    Abc_NtkCovCovers_rec( p, pObj0, vBoundary );
    Abc_NtkCovCovers_rec( p, pObj1, vBoundary );
    // skip the node that spaced out
    if ( (!pObj0->fMarkA && !Abc_ObjGetSupp(pObj0)) ||  // fanin is not ready
         (!pObj1->fMarkA && !Abc_ObjGetSupp(pObj1)) ||  // fanin is not ready
         !Abc_NodeCovPropagate( p, pObj ) )           // node's support or covers cannot be computed
    {
        // save the nodes of the future boundary
        if ( !pObj0->fMarkA && Abc_ObjGetSupp(pObj0) )
            Vec_PtrPush( vBoundary, pObj0 );
        if ( !pObj1->fMarkA && Abc_ObjGetSupp(pObj1) )
            Vec_PtrPush( vBoundary, pObj1 );
        return;
    }
    // consider dropping the fanin supports
//    Abc_NodeCovDropData( p, pObj0 );
//    Abc_NodeCovDropData( p, pObj1 );
}